

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibTruth8Two(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop,word *pRes)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint nVars;
  word (*pawVar4) [4];
  word *puFanins [8];
  word uTruthBot [4];
  word *local_88 [8];
  word local_48 [4];
  
  Exp_Truth8(*(uint *)&pCellBot->field_0x10 >> 0x1c,pCellBot->vExpr,(word **)0x0,local_48);
  if (-1 < InTop) {
    nVars = *(uint *)&pCellTop->field_0x10 >> 0x1c;
    if ((uint)InTop < nVars) {
      uVar1 = *(uint *)&pCellBot->field_0x10 >> 0x1c;
      uVar2 = uVar1;
      for (uVar3 = 0; nVars != uVar3; uVar3 = uVar3 + 1) {
        pawVar4 = s_Truth8 + uVar2;
        if ((uint)InTop == uVar3) {
          pawVar4 = &local_48;
        }
        uVar2 = uVar2 + ((uint)InTop != uVar3);
        local_88[uVar3] = *pawVar4;
      }
      if (uVar1 + nVars == uVar2 + 1) {
        Exp_Truth8(nVars,pCellTop->vExpr,local_88,pRes);
        return;
      }
      __assert_fail("(int)pCellBot->nFanins + (int)pCellTop->nFanins == k + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x114,"void Sfm_LibTruth8Two(Mio_Cell2_t *, Mio_Cell2_t *, int, word *)");
    }
  }
  __assert_fail("InTop >= 0 && InTop < (int)pCellTop->nFanins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                ,0x10e,"void Sfm_LibTruth8Two(Mio_Cell2_t *, Mio_Cell2_t *, int, word *)");
}

Assistant:

void Sfm_LibTruth8Two( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop, word * pRes )
{
    word uTruthBot[4], * puFanins[SFM_SUPP_MAX]; int i, k;
    Exp_Truth8( pCellBot->nFanins, pCellBot->vExpr, NULL, uTruthBot );
    assert( InTop >= 0 && InTop < (int)pCellTop->nFanins );
    for ( i = 0, k = pCellBot->nFanins; i < (int)pCellTop->nFanins; i++ )
        if ( i == InTop )
            puFanins[i] = uTruthBot;
        else
            puFanins[i] = s_Truth8[k++];
    assert( (int)pCellBot->nFanins + (int)pCellTop->nFanins == k + 1 );
    Exp_Truth8( pCellTop->nFanins, pCellTop->vExpr, puFanins, pRes );
}